

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  NodeRef *pNVar15;
  undefined4 uVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  ulong uVar18;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  uint uVar50;
  undefined1 auVar51 [16];
  uint uVar53;
  uint uVar54;
  uint uVar55;
  undefined1 auVar52 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  ulong local_14f8;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  ulong local_14b8;
  ulong local_14b0;
  ulong local_14a8;
  ulong local_14a0;
  ulong local_1498;
  NodeRef *local_1490;
  ulong local_1488;
  Scene *local_1480;
  undefined8 *local_1478;
  NodeRef *local_1470;
  RTCFilterFunctionNArguments args;
  float local_12e8 [4];
  undefined1 local_12d8 [16];
  float local_12c8 [4];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  RTCHitN local_1288 [16];
  undefined4 local_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 local_1268;
  undefined4 uStack_1264;
  undefined4 uStack_1260;
  undefined4 uStack_125c;
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  uint local_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  uint uStack_1200;
  uint uStack_11fc;
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  fVar33 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar69 = ZEXT3264(CONCAT428(fVar33,CONCAT424(fVar33,CONCAT420(fVar33,CONCAT416(fVar33,CONCAT412(
                                                  fVar33,CONCAT48(fVar33,CONCAT44(fVar33,fVar33)))))
                                               )));
  fVar35 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar41._4_4_ = fVar35;
  auVar41._0_4_ = fVar35;
  auVar41._8_4_ = fVar35;
  auVar41._12_4_ = fVar35;
  auVar41._16_4_ = fVar35;
  auVar41._20_4_ = fVar35;
  auVar41._24_4_ = fVar35;
  auVar41._28_4_ = fVar35;
  fVar36 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar44._4_4_ = fVar36;
  auVar44._0_4_ = fVar36;
  auVar44._8_4_ = fVar36;
  auVar44._12_4_ = fVar36;
  auVar44._16_4_ = fVar36;
  auVar44._20_4_ = fVar36;
  auVar44._24_4_ = fVar36;
  auVar44._28_4_ = fVar36;
  fVar33 = fVar33 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar35 = fVar35 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar36 = fVar36 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1498 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_14a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_14a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_14b0 = local_1498 ^ 0x20;
  local_14b8 = local_14a0 ^ 0x20;
  uVar22 = local_14a8 ^ 0x20;
  auVar46._0_8_ = CONCAT44(fVar33,fVar33) ^ 0x8000000080000000;
  auVar46._8_4_ = -fVar33;
  auVar46._12_4_ = -fVar33;
  auVar46._16_4_ = -fVar33;
  auVar46._20_4_ = -fVar33;
  auVar46._24_4_ = -fVar33;
  auVar46._28_4_ = -fVar33;
  auVar49._0_8_ = CONCAT44(fVar35,fVar35) ^ 0x8000000080000000;
  auVar49._8_4_ = -fVar35;
  auVar49._12_4_ = -fVar35;
  auVar49._16_4_ = -fVar35;
  auVar49._20_4_ = -fVar35;
  auVar49._24_4_ = -fVar35;
  auVar49._28_4_ = -fVar35;
  auVar52._0_8_ = CONCAT44(fVar36,fVar36) ^ 0x8000000080000000;
  auVar52._8_4_ = -fVar36;
  auVar52._12_4_ = -fVar36;
  auVar52._16_4_ = -fVar36;
  auVar52._20_4_ = -fVar36;
  auVar52._24_4_ = -fVar36;
  auVar52._28_4_ = -fVar36;
  iVar1 = (tray->tnear).field_0.i[k];
  auVar57._4_4_ = iVar1;
  auVar57._0_4_ = iVar1;
  auVar57._8_4_ = iVar1;
  auVar57._12_4_ = iVar1;
  auVar57._16_4_ = iVar1;
  auVar57._20_4_ = iVar1;
  auVar57._24_4_ = iVar1;
  auVar57._28_4_ = iVar1;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar60._4_4_ = iVar1;
  auVar60._0_4_ = iVar1;
  auVar60._8_4_ = iVar1;
  auVar60._12_4_ = iVar1;
  auVar60._16_4_ = iVar1;
  auVar60._20_4_ = iVar1;
  auVar60._24_4_ = iVar1;
  auVar60._28_4_ = iVar1;
  local_1478 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar26._8_4_ = 0x7fffffff;
  auVar26._0_8_ = 0x7fffffff7fffffff;
  auVar26._12_4_ = 0x7fffffff;
  pNVar15 = stack + 1;
  do {
    local_1470 = pNVar15;
    if (local_1470 == stack) break;
    local_1490 = local_1470 + -1;
    sVar20 = local_1470[-1].ptr;
    do {
      if ((sVar20 & 8) == 0) {
        uVar16 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar30._4_4_ = uVar16;
        auVar30._0_4_ = uVar16;
        auVar30._8_4_ = uVar16;
        auVar30._12_4_ = uVar16;
        auVar30._16_4_ = uVar16;
        auVar30._20_4_ = uVar16;
        auVar30._24_4_ = uVar16;
        auVar30._28_4_ = uVar16;
        uVar17 = sVar20 & 0xfffffffffffffff0;
        auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_1498),auVar30,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_1498));
        auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14a0),auVar30,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14a0));
        auVar27 = vfmadd213ps_fma(ZEXT1632(auVar27),auVar69._0_32_,auVar46);
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar41,auVar49);
        auVar5 = vpmaxsd_avx2(ZEXT1632(auVar27),ZEXT1632(auVar28));
        auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14a8),auVar30,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14a8));
        auVar27 = vfmadd213ps_fma(ZEXT1632(auVar27),auVar44,auVar52);
        auVar6 = vpmaxsd_avx2(ZEXT1632(auVar27),auVar57);
        auVar5 = vpmaxsd_avx2(auVar5,auVar6);
        auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14b0),auVar30,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14b0));
        auVar27 = vfmadd213ps_fma(ZEXT1632(auVar27),auVar69._0_32_,auVar46);
        auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14b8),auVar30,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + local_14b8));
        auVar28 = vfmadd213ps_fma(ZEXT1632(auVar28),auVar41,auVar49);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + uVar22),auVar30,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + uVar22));
        auVar6 = vpminsd_avx2(ZEXT1632(auVar27),ZEXT1632(auVar28));
        auVar27 = vfmadd213ps_fma(ZEXT1632(auVar51),auVar44,auVar52);
        auVar7 = vpminsd_avx2(ZEXT1632(auVar27),auVar60);
        auVar6 = vpminsd_avx2(auVar6,auVar7);
        auVar5 = vcmpps_avx(auVar5,auVar6,2);
        if (((uint)sVar20 & 7) == 6) {
          auVar6 = vcmpps_avx(*(undefined1 (*) [32])(uVar17 + 0x1c0),auVar30,2);
          auVar7 = vcmpps_avx(auVar30,*(undefined1 (*) [32])(uVar17 + 0x1e0),1);
          auVar6 = vandps_avx(auVar6,auVar7);
          auVar5 = vandps_avx(auVar6,auVar5);
          auVar27 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
        }
        else {
          auVar27 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
        }
        auVar27 = vpsllw_avx(auVar27,0xf);
        auVar27 = vpacksswb_avx(auVar27,auVar27);
        unaff_RBP = (ulong)(byte)(SUB161(auVar27 >> 7,0) & 1 | (SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar27 >> 0x3f,0) << 7);
      }
      if ((sVar20 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar50 = 4;
        }
        else {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          lVar23 = 0;
          for (uVar17 = unaff_RBP; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          for (uVar17 = unaff_RBP - 1 & unaff_RBP; sVar20 = *(size_t *)(uVar19 + lVar23 * 8),
              uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
            local_1490->ptr = sVar20;
            local_1490 = local_1490 + 1;
            lVar23 = 0;
            for (uVar21 = uVar17; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar23 = lVar23 + 1;
            }
          }
          uVar50 = 0;
        }
      }
      else {
        uVar50 = 6;
      }
    } while (uVar50 == 0);
    if (uVar50 == 6) {
      uVar17 = (ulong)((uint)sVar20 & 0xf);
      uVar50 = 0;
      uVar19 = uVar17 - 8;
      bVar24 = uVar17 != 8;
      if (bVar24) {
        uVar17 = sVar20 & 0xfffffffffffffff0;
        uVar21 = 0;
        do {
          lVar23 = uVar21 * 0x140;
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar28._4_4_ = uVar16;
          auVar28._0_4_ = uVar16;
          auVar28._8_4_ = uVar16;
          auVar28._12_4_ = uVar16;
          auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x90 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + lVar23));
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xa0 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x10 + lVar23));
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xb0 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x20 + lVar23));
          auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xc0 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x30 + lVar23));
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xd0 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x40 + lVar23));
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xe0 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x50 + lVar23));
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xf0 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x60 + lVar23));
          auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x100 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x70 + lVar23));
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x110 + lVar23),auVar28,
                                    *(undefined1 (*) [16])(uVar17 + 0x80 + lVar23));
          auVar28 = vsubps_avx(auVar38,auVar27);
          auVar27 = vsubps_avx(auVar39,auVar51);
          auVar51 = vsubps_avx(auVar43,auVar59);
          auVar59 = vsubps_avx(auVar47,auVar38);
          auVar47 = vsubps_avx(auVar48,auVar39);
          auVar48 = vsubps_avx(auVar29,auVar43);
          auVar29._0_4_ = auVar27._0_4_ * auVar48._0_4_;
          auVar29._4_4_ = auVar27._4_4_ * auVar48._4_4_;
          auVar29._8_4_ = auVar27._8_4_ * auVar48._8_4_;
          auVar29._12_4_ = auVar27._12_4_ * auVar48._12_4_;
          local_12b8 = vfmsub231ps_fma(auVar29,auVar47,auVar51);
          auVar31._0_4_ = auVar51._0_4_ * auVar59._0_4_;
          auVar31._4_4_ = auVar51._4_4_ * auVar59._4_4_;
          auVar31._8_4_ = auVar51._8_4_ * auVar59._8_4_;
          auVar31._12_4_ = auVar51._12_4_ * auVar59._12_4_;
          local_12a8 = vfmsub231ps_fma(auVar31,auVar48,auVar28);
          uVar16 = *(undefined4 *)(ray + k * 4);
          auVar61._4_4_ = uVar16;
          auVar61._0_4_ = uVar16;
          auVar61._8_4_ = uVar16;
          auVar61._12_4_ = uVar16;
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar63._4_4_ = uVar16;
          auVar63._0_4_ = uVar16;
          auVar63._8_4_ = uVar16;
          auVar63._12_4_ = uVar16;
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar66._4_4_ = uVar16;
          auVar66._0_4_ = uVar16;
          auVar66._8_4_ = uVar16;
          auVar66._12_4_ = uVar16;
          fVar33 = *(float *)(ray + k * 4 + 0x40);
          auVar56._4_4_ = fVar33;
          auVar56._0_4_ = fVar33;
          auVar56._8_4_ = fVar33;
          auVar56._12_4_ = fVar33;
          auVar38 = vsubps_avx(auVar38,auVar61);
          fVar35 = *(float *)(ray + k * 4 + 0x50);
          auVar62._4_4_ = fVar35;
          auVar62._0_4_ = fVar35;
          auVar62._8_4_ = fVar35;
          auVar62._12_4_ = fVar35;
          auVar39 = vsubps_avx(auVar39,auVar63);
          fVar36 = *(float *)(ray + k * 4 + 0x60);
          auVar64._4_4_ = fVar36;
          auVar64._0_4_ = fVar36;
          auVar64._8_4_ = fVar36;
          auVar64._12_4_ = fVar36;
          auVar43 = vsubps_avx(auVar43,auVar66);
          auVar67._0_4_ = fVar33 * auVar39._0_4_;
          auVar67._4_4_ = fVar33 * auVar39._4_4_;
          auVar67._8_4_ = fVar33 * auVar39._8_4_;
          auVar67._12_4_ = fVar33 * auVar39._12_4_;
          auVar29 = vfmsub231ps_fma(auVar67,auVar38,auVar62);
          auVar58._0_4_ = auVar48._0_4_ * auVar29._0_4_;
          auVar58._4_4_ = auVar48._4_4_ * auVar29._4_4_;
          auVar58._8_4_ = auVar48._8_4_ * auVar29._8_4_;
          auVar58._12_4_ = auVar48._12_4_ * auVar29._12_4_;
          auVar68._0_4_ = auVar51._0_4_ * auVar29._0_4_;
          auVar68._4_4_ = auVar51._4_4_ * auVar29._4_4_;
          auVar68._8_4_ = auVar51._8_4_ * auVar29._8_4_;
          auVar68._12_4_ = auVar51._12_4_ * auVar29._12_4_;
          auVar51._0_4_ = fVar36 * auVar38._0_4_;
          auVar51._4_4_ = fVar36 * auVar38._4_4_;
          auVar51._8_4_ = fVar36 * auVar38._8_4_;
          auVar51._12_4_ = fVar36 * auVar38._12_4_;
          auVar48 = vfmsub231ps_fma(auVar51,auVar43,auVar56);
          auVar51 = vfmadd231ps_fma(auVar58,auVar48,auVar47);
          auVar48 = vfmadd231ps_fma(auVar68,auVar27,auVar48);
          auVar45._0_4_ = auVar28._0_4_ * auVar47._0_4_;
          auVar45._4_4_ = auVar28._4_4_ * auVar47._4_4_;
          auVar45._8_4_ = auVar28._8_4_ * auVar47._8_4_;
          auVar45._12_4_ = auVar28._12_4_ * auVar47._12_4_;
          local_1298 = vfmsub231ps_fma(auVar45,auVar59,auVar27);
          auVar47._0_4_ = fVar35 * auVar43._0_4_;
          auVar47._4_4_ = fVar35 * auVar43._4_4_;
          auVar47._8_4_ = fVar35 * auVar43._8_4_;
          auVar47._12_4_ = fVar35 * auVar43._12_4_;
          auVar29 = vfmsub231ps_fma(auVar47,auVar39,auVar64);
          auVar65._0_4_ = fVar36 * local_1298._0_4_;
          auVar65._4_4_ = fVar36 * local_1298._4_4_;
          auVar65._8_4_ = fVar36 * local_1298._8_4_;
          auVar65._12_4_ = fVar36 * local_1298._12_4_;
          auVar27 = vfmadd231ps_fma(auVar65,local_12a8,auVar62);
          auVar47 = vfmadd231ps_fma(auVar27,local_12b8,auVar56);
          auVar51 = vfmadd231ps_fma(auVar51,auVar29,auVar59);
          auVar27._8_4_ = 0x80000000;
          auVar27._0_8_ = 0x8000000080000000;
          auVar27._12_4_ = 0x80000000;
          auVar27 = vandps_avx(auVar47,auVar27);
          uVar50 = auVar27._0_4_;
          auVar40._0_4_ = (float)(uVar50 ^ auVar51._0_4_);
          uVar53 = auVar27._4_4_;
          auVar40._4_4_ = (float)(uVar53 ^ auVar51._4_4_);
          uVar54 = auVar27._8_4_;
          auVar40._8_4_ = (float)(uVar54 ^ auVar51._8_4_);
          uVar55 = auVar27._12_4_;
          auVar40._12_4_ = (float)(uVar55 ^ auVar51._12_4_);
          auVar27 = vfmadd231ps_fma(auVar48,auVar28,auVar29);
          auVar48._0_4_ = (float)(uVar50 ^ auVar27._0_4_);
          auVar48._4_4_ = (float)(uVar53 ^ auVar27._4_4_);
          auVar48._8_4_ = (float)(uVar54 ^ auVar27._8_4_);
          auVar48._12_4_ = (float)(uVar55 ^ auVar27._12_4_);
          auVar51 = ZEXT816(0) << 0x20;
          auVar27 = vcmpps_avx(auVar40,auVar51,5);
          auVar28 = vcmpps_avx(auVar48,auVar51,5);
          auVar27 = vandps_avx(auVar28,auVar27);
          auVar28 = vandps_avx(auVar47,auVar26);
          auVar51 = vcmpps_avx(auVar47,auVar51,4);
          auVar27 = vandps_avx(auVar27,auVar51);
          auVar59._0_4_ = auVar48._0_4_ + auVar40._0_4_;
          auVar59._4_4_ = auVar48._4_4_ + auVar40._4_4_;
          auVar59._8_4_ = auVar48._8_4_ + auVar40._8_4_;
          auVar59._12_4_ = auVar48._12_4_ + auVar40._12_4_;
          auVar51 = vcmpps_avx(auVar59,auVar28,2);
          auVar59 = auVar51 & auVar27;
          if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar59[0xf] < '\0') {
            auVar27 = vandps_avx(auVar27,auVar51);
            auVar42._0_4_ = local_1298._0_4_ * auVar43._0_4_;
            auVar42._4_4_ = local_1298._4_4_ * auVar43._4_4_;
            auVar42._8_4_ = local_1298._8_4_ * auVar43._8_4_;
            auVar42._12_4_ = local_1298._12_4_ * auVar43._12_4_;
            auVar51 = vfmadd213ps_fma(auVar39,local_12a8,auVar42);
            auVar51 = vfmadd213ps_fma(auVar38,local_12b8,auVar51);
            auVar38._0_4_ = (float)(uVar50 ^ auVar51._0_4_);
            auVar38._4_4_ = (float)(uVar53 ^ auVar51._4_4_);
            auVar38._8_4_ = (float)(uVar54 ^ auVar51._8_4_);
            auVar38._12_4_ = (float)(uVar55 ^ auVar51._12_4_);
            fVar33 = *(float *)(ray + k * 4 + 0x30);
            auVar39._0_4_ = auVar28._0_4_ * fVar33;
            auVar39._4_4_ = auVar28._4_4_ * fVar33;
            auVar39._8_4_ = auVar28._8_4_ * fVar33;
            auVar39._12_4_ = auVar28._12_4_ * fVar33;
            auVar51 = vcmpps_avx(auVar39,auVar38,1);
            fVar33 = *(float *)(ray + k * 4 + 0x80);
            auVar43._0_4_ = auVar28._0_4_ * fVar33;
            auVar43._4_4_ = auVar28._4_4_ * fVar33;
            auVar43._8_4_ = auVar28._8_4_ * fVar33;
            auVar43._12_4_ = auVar28._12_4_ * fVar33;
            auVar59 = vcmpps_avx(auVar38,auVar43,2);
            auVar51 = vandps_avx(auVar51,auVar59);
            auVar59 = auVar27 & auVar51;
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              auVar27 = vandps_avx(auVar27,auVar51);
              local_1480 = context->scene;
              auVar51 = vrcpps_avx(auVar28);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = &DAT_3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar28 = vfnmadd213ps_fma(auVar28,auVar51,auVar32);
              auVar28 = vfmadd132ps_fma(auVar28,auVar51,auVar51);
              fVar33 = auVar28._0_4_;
              fVar35 = auVar28._4_4_;
              fVar36 = auVar28._8_4_;
              fVar37 = auVar28._12_4_;
              local_12c8[0] = fVar33 * auVar38._0_4_;
              local_12c8[1] = fVar35 * auVar38._4_4_;
              local_12c8[2] = fVar36 * auVar38._8_4_;
              local_12c8[3] = fVar37 * auVar38._12_4_;
              local_12e8[0] = fVar33 * auVar40._0_4_;
              local_12e8[1] = fVar35 * auVar40._4_4_;
              local_12e8[2] = fVar36 * auVar40._8_4_;
              local_12e8[3] = fVar37 * auVar40._12_4_;
              local_12d8._0_4_ = fVar33 * auVar48._0_4_;
              local_12d8._4_4_ = fVar35 * auVar48._4_4_;
              local_12d8._8_4_ = fVar36 * auVar48._8_4_;
              local_12d8._12_4_ = fVar37 * auVar48._12_4_;
              uVar16 = vmovmskps_avx(auVar27);
              local_14f8 = CONCAT44((int)((ulong)local_1480 >> 0x20),uVar16);
              do {
                uVar8 = 0;
                for (uVar18 = local_14f8; (uVar18 & 1) == 0;
                    uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  uVar8 = uVar8 + 1;
                }
                uVar50 = *(uint *)(lVar23 + uVar17 + 0x120 + uVar8 * 4);
                local_1488 = (ulong)uVar50;
                pGVar3 = (local_1480->geometries).items[local_1488].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_14f8 = local_14f8 ^ 1L << (uVar8 & 0x3f);
                  bVar25 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar25 = false;
                }
                else {
                  local_11f8 = auVar69._0_32_;
                  uVar18 = (ulong)(uint)((int)uVar8 * 4);
                  uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar2 = *(undefined4 *)((long)local_12e8 + uVar18);
                  local_1258._4_4_ = uVar2;
                  local_1258._0_4_ = uVar2;
                  local_1258._8_4_ = uVar2;
                  local_1258._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_12d8 + uVar18);
                  local_1248._4_4_ = uVar2;
                  local_1248._0_4_ = uVar2;
                  local_1248._8_4_ = uVar2;
                  local_1248._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12c8 + uVar18);
                  args.context = context->user;
                  local_1228._4_4_ = uVar50;
                  local_1228._0_4_ = uVar50;
                  local_1228._8_4_ = uVar50;
                  local_1228._12_4_ = uVar50;
                  uVar2 = *(undefined4 *)(lVar23 + uVar17 + 0x130 + uVar18);
                  local_1238._4_4_ = uVar2;
                  local_1238._0_4_ = uVar2;
                  local_1238._8_4_ = uVar2;
                  local_1238._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_12b8 + uVar18);
                  local_1278 = *(undefined4 *)(local_12a8 + uVar18);
                  local_1268 = *(undefined4 *)(local_1298 + uVar18);
                  local_1288[0] = (RTCHitN)(char)uVar2;
                  local_1288[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1288[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1288[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1288[4] = (RTCHitN)(char)uVar2;
                  local_1288[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1288[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1288[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1288[8] = (RTCHitN)(char)uVar2;
                  local_1288[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1288[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1288[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1288[0xc] = (RTCHitN)(char)uVar2;
                  local_1288[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1288[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1288[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_1274 = local_1278;
                  uStack_1270 = local_1278;
                  uStack_126c = local_1278;
                  uStack_1264 = local_1268;
                  uStack_1260 = local_1268;
                  uStack_125c = local_1268;
                  vpcmpeqd_avx2(ZEXT1632(local_1228),ZEXT1632(local_1228));
                  uStack_1214 = (args.context)->instID[0];
                  local_1218 = uStack_1214;
                  uStack_1210 = uStack_1214;
                  uStack_120c = uStack_1214;
                  uStack_1208 = (args.context)->instPrimID[0];
                  uStack_1204 = uStack_1208;
                  uStack_1200 = uStack_1208;
                  uStack_11fc = uStack_1208;
                  local_14c8 = *local_1478;
                  uStack_14c0 = local_1478[1];
                  args.valid = (int *)&local_14c8;
                  args.geometryUserPtr = pGVar3->userPtr;
                  args.hit = local_1288;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&args);
                  }
                  auVar13._8_8_ = uStack_14c0;
                  auVar13._0_8_ = local_14c8;
                  if (auVar13 == (undefined1  [16])0x0) {
                    auVar27 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar27 = auVar27 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&args);
                    }
                    auVar14._8_8_ = uStack_14c0;
                    auVar14._0_8_ = local_14c8;
                    auVar28 = vpcmpeqd_avx((undefined1  [16])0x0,auVar14);
                    auVar27 = auVar28 ^ _DAT_01febe20;
                    auVar34._8_4_ = 0xff800000;
                    auVar34._0_8_ = 0xff800000ff800000;
                    auVar34._12_4_ = 0xff800000;
                    auVar28 = vblendvps_avx(auVar34,*(undefined1 (*) [16])(args.ray + 0x80),auVar28)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar28;
                  }
                  auVar27 = vpslld_avx(auVar27,0x1f);
                  bVar11 = (auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar12 = (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar10 = (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar9 = -1 < auVar27[0xf];
                  bVar25 = ((bVar11 && bVar12) && bVar10) && bVar9;
                  if (((bVar11 && bVar12) && bVar10) && bVar9) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar16;
                    local_14f8 = local_14f8 ^ 1L << (uVar8 & 0x3f);
                  }
                  auVar69 = ZEXT3264(local_11f8);
                }
                if (!bVar25) {
                  uVar50 = 0;
                  if (bVar24) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar50 = 1;
                  }
                  goto LAB_00651649;
                }
              } while (local_14f8 != 0);
            }
          }
          uVar50 = 0;
          uVar21 = uVar21 + 1;
          bVar24 = uVar21 < uVar19;
        } while (uVar21 != uVar19);
      }
    }
LAB_00651649:
    pNVar15 = local_1490;
  } while ((uVar50 & 3) == 0);
  return local_1470 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }